

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_opendir(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_user_func *pjVar1;
  uint uVar2;
  int iVar3;
  jx9_io_stream *pjVar4;
  undefined8 *pChunk;
  char *zMessage;
  sxi32 iErr;
  jx9_value *pjVar5;
  jx9_vm *pVm;
  char *zPath;
  int iLen;
  char *local_38;
  int local_2c;
  
  if ((nArg < 1) || (((*apArg)->iFlags & 1) == 0)) {
    pjVar1 = pCtx->pFunc;
    pVm = pCtx->pVm;
    zMessage = "Expecting a directory path";
    iErr = 2;
LAB_0013d0d5:
    jx9VmThrowError(pVm,&pjVar1->sName,iErr,zMessage);
  }
  else {
    local_38 = jx9_value_to_string(*apArg,&local_2c);
    pjVar4 = jx9VmGetStreamDevice(pCtx->pVm,&local_38,local_2c);
    if (pjVar4 == (jx9_io_stream *)0x0) {
      jx9_context_throw_error_format
                (pCtx,2,"No stream device is associated with the given path(%s)",local_38);
    }
    else if (pjVar4->xOpenDir == (_func_int_char_ptr_jx9_value_ptr_void_ptr_ptr *)0x0) {
      jx9_context_throw_error_format
                (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",
                 (pCtx->pFunc->sName).zString,pjVar4->zName);
    }
    else {
      pChunk = (undefined8 *)jx9_context_alloc_chunk(pCtx,0x38,1,0);
      pVm = pCtx->pVm;
      if (pChunk == (undefined8 *)0x0) {
        pjVar1 = pCtx->pFunc;
        zMessage = "JX9 is running out of memory";
        iErr = 1;
        goto LAB_0013d0d5;
      }
      *pChunk = pjVar4;
      pChunk[3] = 0;
      pChunk[4] = 0;
      pChunk[2] = pVm;
      *(undefined4 *)(pChunk + 5) = 0;
      pChunk[6] = 0xfeac1400000000;
      if (nArg == 1) {
        pjVar5 = (jx9_value *)0x0;
      }
      else {
        pjVar5 = apArg[1];
      }
      iVar3 = (*pjVar4->xOpenDir)(local_38,pjVar5,(void **)(pChunk + 1));
      if (iVar3 == 0) {
        pjVar5 = pCtx->pRet;
        jx9MemObjRelease(pjVar5);
        (pjVar5->x).pOther = pChunk;
        uVar2 = 0x100;
        goto LAB_0013d0f2;
      }
      SyBlobRelease((SyBlob *)(pChunk + 2));
      *(undefined4 *)((long)pChunk + 0x34) = 0x2126;
      jx9_context_free_chunk(pCtx,pChunk);
    }
  }
  pjVar5 = pCtx->pRet;
  jx9MemObjRelease(pjVar5);
  (pjVar5->x).rVal = 0.0;
  uVar2 = 8;
LAB_0013d0f2:
  pjVar5->iFlags = pjVar5->iFlags & 0xfffffe90U | uVar2;
  return 0;
}

Assistant:

static int jx9Builtin_opendir(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zPath;
	io_private *pDev;
	int iLen, rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting a directory path");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the target path */
	zPath  = jx9_value_to_string(apArg[0], &iLen);
	/* Try to extract a stream */
	pStream = jx9VmGetStreamDevice(pCtx->pVm, &zPath, iLen);
	if( pStream == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"No stream device is associated with the given path(%s)", zPath);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	if( pStream->xOpenDir == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pStream->zName
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Allocate a new IO private instance */
	pDev = (io_private *)jx9_context_alloc_chunk(pCtx, sizeof(io_private), TRUE, FALSE);
	if( pDev == 0 ){
		jx9_context_throw_error(pCtx, JX9_CTX_ERR, "JX9 is running out of memory");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Initialize the structure */
	InitIOPrivate(pCtx->pVm, pStream, pDev);
	/* Open the target directory */
	rc = pStream->xOpenDir(zPath, nArg > 1 ? apArg[1] : 0, &pDev->pHandle);
	if( rc != JX9_OK ){
		/* IO error, return FALSE */
		ReleaseIOPrivate(pCtx, pDev);
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the handle as a resource */
		jx9_result_resource(pCtx, pDev);
	}
	return JX9_OK;
}